

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O1

bool __thiscall QFSFileEnginePrivate::nativeSyncToDisk(QFSFileEnginePrivate *this)

{
  QFSFileEnginePrivate *this_00;
  int iVar1;
  int *piVar2;
  
  this_00 = (QFSFileEnginePrivate *)(this->super_QAbstractFileEnginePrivate).q_ptr;
  do {
    if ((FILE *)this->fh == (FILE *)0x0) {
      iVar1 = this->fd;
    }
    else {
      iVar1 = fileno((FILE *)this->fh);
    }
    iVar1 = fdatasync(iVar1);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (iVar1 != 0) {
    nativeSyncToDisk(this_00);
  }
  return iVar1 == 0;
}

Assistant:

bool QFSFileEnginePrivate::nativeSyncToDisk()
{
    Q_Q(QFSFileEngine);
    int ret;
#if defined(_POSIX_SYNCHRONIZED_IO) && _POSIX_SYNCHRONIZED_IO > 0
    QT_EINTR_LOOP(ret, fdatasync(nativeHandle()));
#else
    QT_EINTR_LOOP(ret, fsync(nativeHandle()));
#endif
    if (ret != 0)
        q->setError(QFile::WriteError, qt_error_string(errno));
    return ret == 0;
}